

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cab_filename.c
# Opt level: O0

void test_read_format_cab_filename_CP932_UTF8(char *refname)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  la_int64_t lVar4;
  archive_entry *local_20;
  archive_entry *ae;
  archive *a;
  char *refname_local;
  
  a = (archive *)refname;
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                   ,L'`');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    ae = (archive_entry *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                     ,L'd',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae);
    iVar1 = archive_read_support_format_all((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
    iVar1 = archive_read_set_options((archive *)ae,"hdrcharset=CP932");
    if (iVar1 == 0) {
      wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'm',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",ae);
      iVar1 = archive_read_next_header((archive *)ae,&local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      pcVar3 = archive_entry_pathname(local_20);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                 ,L'}',anon_var_dwarf_1f9bc,
                 "\"\\xe8\\xa1\\xa8\\xe3\\x81\\xa0\\xe3\\x82\\x88\\x2f\" \"\\xe6\\xbc\\xa2\\xe5\\xad\\x97\\x2e\\x74\\x78\\x74\""
                 ,pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\x01');
      lVar4 = archive_entry_size(local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'~',5,"5",lVar4,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x80',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x81',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",ae);
      iVar1 = archive_read_next_header((archive *)ae,&local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae)
      ;
      pcVar3 = archive_entry_pathname(local_20);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                 ,L'\x90',anon_var_dwarf_1f9dc,
                 "\"\\xe8\\xa1\\xa8\\xe3\\x81\\xa0\\xe3\\x82\\x88\\x2f\" \"\\xe4\\xb8\\x80\\xe8\\xa6\\xa7\\xe8\\xa1\\xa8\\x2e\\x74\\x78\\x74\""
                 ,pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\x01');
      lVar4 = archive_entry_size(local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x92',5,"5",lVar4,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x93',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x94',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",ae);
      iVar1 = archive_read_next_header((archive *)ae,&local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x98',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae
                         );
      iVar1 = archive_filter_code((archive *)ae,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x9b',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          ae);
      iVar1 = archive_format((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                          ,L'\x9c',0xc0000,"ARCHIVE_FORMAT_CAB",(long)iVar1,"archive_format(a)",ae);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                     ,L'h');
      test_skipping("This system cannot convert character-set from CP932 to UTF-8.");
    }
    iVar1 = archive_read_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'\xa0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cab_filename.c"
                        ,L'¡',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

static void
test_read_format_cab_filename_CP932_UTF8(const char *refname)
{
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read CAB filename in en_US.UTF-8 with "hdrcharset=CP932" option.
	 */
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=CP932")) {
		skipping("This system cannot convert character-set"
		    " from CP932 to UTF-8.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
#if defined(__APPLE__)
	/* Compare NFD string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\x9f\xe3\x82\x99\xe3\x82\x88\x2f"
	    "\xe6\xbc\xa2\xe5\xad\x97\x2e\x74\x78\x74",
	    archive_entry_pathname(ae));
	assertEqualInt(5, archive_entry_size(ae));
#else
	/* Compare NFC string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\xa0\xe3\x82\x88\x2f"
	    "\xe6\xbc\xa2\xe5\xad\x97\x2e\x74\x78\x74",
	    archive_entry_pathname(ae));
	assertEqualInt(5, archive_entry_size(ae));
#endif
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
#if defined(__APPLE__)
	/* Compare NFD string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\x9f\xe3\x82\x99\xe3\x82\x88\x2f"
	    "\xe4\xb8\x80\xe8\xa6\xa7\xe8\xa1\xa8\x2e\x74\x78\x74",
	    archive_entry_pathname(ae));
#else
	/* Compare NFC string. */
	assertEqualUTF8String(
	    "\xe8\xa1\xa8\xe3\x81\xa0\xe3\x82\x88\x2f"
	    "\xe4\xb8\x80\xe8\xa6\xa7\xe8\xa1\xa8\x2e\x74\x78\x74",
	    archive_entry_pathname(ae));
#endif
	assertEqualInt(5, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_CAB, archive_format(a));

	/* Close the archive. */
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}